

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoind.cpp
# Opt level: O3

int fork_daemon(bool nochdir,bool noclose,TokenPipeEnd *endpoint)

{
  __pid_t _Var1;
  int iVar2;
  __pid_t _Var3;
  uint __fd;
  __pid_t _Var4;
  byte bVar5;
  long in_FS_OFFSET;
  optional<TokenPipe> umbilical;
  undefined1 local_40 [12];
  char local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  TokenPipe::Make();
  _Var4 = -1;
  _Var3 = _Var4;
  if (local_34 == '\x01') {
    _Var1 = fork();
    if (-1 < _Var1) {
      if (_Var1 == 0) {
        TokenPipe::TakeWriteEnd((TokenPipe *)local_40);
        TokenPipeEnd::Close(endpoint);
        endpoint->m_fd = local_40._0_4_;
        local_40._0_4_ = -1;
        TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)local_40);
        TokenPipe::TakeReadEnd((TokenPipe *)local_40);
        TokenPipeEnd::Close((TokenPipeEnd *)local_40);
        TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)local_40);
        _Var3 = setsid();
        if ((_Var3 < 0) || ((!nochdir && (iVar2 = chdir("/"), iVar2 != 0)))) goto LAB_0016c191;
        if (!noclose) {
          __fd = open("/dev/null",2);
          if ((int)__fd < 0) {
LAB_0016c191:
            exit(1);
          }
          iVar2 = dup2(__fd,0);
          bVar5 = 1;
          if ((-1 < iVar2) && (iVar2 = dup2(__fd,1), -1 < iVar2)) {
            iVar2 = dup2(__fd,2);
            bVar5 = (byte)((uint)iVar2 >> 0x1f);
          }
          if (2 < __fd) {
            close(__fd);
          }
          if (bVar5 != 0) goto LAB_0016c191;
        }
        TokenPipeEnd::TokenWrite(endpoint,'\0');
        _Var3 = 0;
      }
      else {
        TokenPipe::TakeReadEnd((TokenPipe *)local_40);
        TokenPipeEnd::Close(endpoint);
        endpoint->m_fd = local_40._0_4_;
        local_40._0_4_ = -1;
        TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)local_40);
        TokenPipe::TakeWriteEnd((TokenPipe *)local_40);
        TokenPipeEnd::Close((TokenPipeEnd *)local_40);
        TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)local_40);
        iVar2 = TokenPipeEnd::TokenRead(endpoint);
        _Var3 = _Var1;
        if (iVar2 != 0) {
          TokenPipeEnd::Close(endpoint);
          _Var3 = _Var4;
        }
      }
    }
  }
  if (local_34 == '\x01') {
    local_34 = '\0';
    TokenPipe::~TokenPipe((TokenPipe *)(local_40 + 4));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return _Var3;
}

Assistant:

int fork_daemon(bool nochdir, bool noclose, TokenPipeEnd& endpoint)
{
    // communication pipe with child process
    std::optional<TokenPipe> umbilical = TokenPipe::Make();
    if (!umbilical) {
        return -1; // pipe or pipe2 failed.
    }

    int pid = fork();
    if (pid < 0) {
        return -1; // fork failed.
    }
    if (pid != 0) {
        // Parent process gets read end, closes write end.
        endpoint = umbilical->TakeReadEnd();
        umbilical->TakeWriteEnd().Close();

        int status = endpoint.TokenRead();
        if (status != 0) { // Something went wrong while setting up child process.
            endpoint.Close();
            return -1;
        }

        return pid;
    }
    // Child process gets write end, closes read end.
    endpoint = umbilical->TakeWriteEnd();
    umbilical->TakeReadEnd().Close();

#if HAVE_DECL_SETSID
    if (setsid() < 0) {
        exit(1); // setsid failed.
    }
#endif

    if (!nochdir) {
        if (chdir("/") != 0) {
            exit(1); // chdir failed.
        }
    }
    if (!noclose) {
        // Open /dev/null, and clone it into STDIN, STDOUT and STDERR to detach
        // from terminal.
        int fd = open("/dev/null", O_RDWR);
        if (fd >= 0) {
            bool err = dup2(fd, STDIN_FILENO) < 0 || dup2(fd, STDOUT_FILENO) < 0 || dup2(fd, STDERR_FILENO) < 0;
            // Don't close if fd<=2 to try to handle the case where the program was invoked without any file descriptors open.
            if (fd > 2) close(fd);
            if (err) {
                exit(1); // dup2 failed.
            }
        } else {
            exit(1); // open /dev/null failed.
        }
    }
    endpoint.TokenWrite(0); // Success
    return 0;
}